

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::StringFieldGenerator::StringFieldGenerator
          (StringFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex)

{
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  StringFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__StringFieldGenerator_0040fce8;
  this->descriptor_ = descriptor;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  this->messageBitIndex_ = messageBitIndex;
  this->builderBitIndex_ = builderBitIndex;
  anon_unknown_2::SetPrimitiveVariables
            (descriptor,messageBitIndex,builderBitIndex,&this->variables_);
  return;
}

Assistant:

StringFieldGenerator::
StringFieldGenerator(const FieldDescriptor* descriptor,
                     int messageBitIndex,
                     int builderBitIndex)
  : descriptor_(descriptor), messageBitIndex_(messageBitIndex),
    builderBitIndex_(builderBitIndex) {
  SetPrimitiveVariables(descriptor, messageBitIndex, builderBitIndex,
                        &variables_);
}